

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizard::setButton(QWizard *this,WizardButton which,QAbstractButton *button)

{
  long lVar1;
  QWizardPrivate *this_00;
  iterator iVar2;
  QWizardPrivate *in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QAbstractButton *oldButton;
  QWizardPrivate *d;
  QMap<int,_QString> *value;
  QWizardPrivate *in_stack_ffffffffffffff98;
  QWidget *in_stack_ffffffffffffffa0;
  QWizardPrivate *this_01;
  WizardButton WVar3;
  undefined4 in_stack_ffffffffffffffd0;
  
  WVar3 = (WizardButton)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QWizard *)0x7bbcee);
  if ((in_ESI < 9) &&
     (*(QWizardPrivate **)((long)&this_00->field_20 + (long)(int)in_ESI * 8) != in_RDX)) {
    this_01 = *(QWizardPrivate **)((long)&this_00->field_20 + (long)(int)in_ESI * 8);
    if ((this_01 != (QWizardPrivate *)0x0) &&
       (in_stack_ffffffffffffff98 = this_01,
       QLayout::removeWidget((QLayout *)this_01,in_stack_ffffffffffffffa0),
       this_01 = in_stack_ffffffffffffff98, in_stack_ffffffffffffff98 != (QWizardPrivate *)0x0)) {
      (**(code **)(*(long *)&(in_stack_ffffffffffffff98->super_QDialogPrivate).super_QWidgetPrivate
                  + 0x20))();
    }
    *(QWizardPrivate **)((long)&this_00->field_20 + (long)(int)in_ESI * 8) = in_RDX;
    if (in_RDX == (QWizardPrivate *)0x0) {
      QMap<int,_QString>::remove(&this_00->buttonCustomTexts,&stack0xffffffffffffffd4);
      QWizardPrivate::ensureButton
                ((QWizardPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),WVar3);
    }
    else {
      QWidget::setParent((QWidget *)this_00,(QWidget *)this_01);
      value = &this_00->buttonCustomTexts;
      QAbstractButton::text((QAbstractButton *)in_stack_ffffffffffffff98);
      iVar2 = QMap<int,_QString>::insert
                        ((QMap<int,_QString> *)in_stack_ffffffffffffffa0,
                         (int *)in_stack_ffffffffffffff98,(QString *)value);
      WVar3 = iVar2.i._M_node._4_4_;
      QString::~QString((QString *)0x7bbde9);
      QWizardPrivate::connectButton(this_01,WVar3);
    }
    QWizardPrivate::updateButtonLayout(in_RDX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizard::setButton(WizardButton which, QAbstractButton *button)
{
    Q_D(QWizard);

    if (uint(which) >= NButtons || d->btns[which] == button)
        return;

    if (QAbstractButton *oldButton = d->btns[which]) {
        d->buttonLayout->removeWidget(oldButton);
        delete oldButton;
    }

    d->btns[which] = button;
    if (button) {
        button->setParent(d->antiFlickerWidget);
        d->buttonCustomTexts.insert(which, button->text());
        d->connectButton(which);
    } else {
        d->buttonCustomTexts.remove(which); // ### what about page-specific texts set for 'which'
        d->ensureButton(which);             // (QWizardPage::setButtonText())? Clear them as well?
    }

    d->updateButtonLayout();
}